

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

long search::go(void)

{
  ostream *poVar1;
  long extraout_RAX;
  ulong uVar2;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  SearchInfo *in_RSI;
  Board *in_RDI;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  _Alloc_hider this;
  Move move;
  PVTable pvtable;
  string local_b8;
  SearchInfo *local_90;
  int local_84;
  Board *local_80;
  ulong local_78;
  Move local_70;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_board::Move>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  in_RDI->ply = 0;
  local_80 = in_RDI;
  memset(in_RDI->searchHistory,0,0x1a60);
  SearchInfo::reset(in_RSI);
  if (in_RSI->depth == -1 || 0 < in_RSI->depth) {
    uVar2 = 1;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    uVar3 = 0;
    _Var6._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
    local_90 = in_RSI;
    do {
      local_78 = uVar2;
      local_84 = negamax(-0x7fffffff,0x7ffffffe,(int)uVar2,local_80,local_90,(PVTable *)&local_68);
      uVar5 = uVar3;
      this._M_p = _Var6._M_p;
      if (local_90->stopped != false) break;
      PVTable::getPV((vector<board::Move,_std::allocator<board::Move>_> *)&local_b8,
                     (PVTable *)&local_68,local_80);
      uVar5 = local_b8.field_2._M_allocated_capacity;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b8._M_string_length;
      this._M_p = local_b8._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(_Var6._M_p,uVar3 - (long)_Var6._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_b8._M_dataplus._M_p,
                        local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"info score cp ",0xe)
      ;
      std::ostream::operator<<((ostream *)&std::cout,local_84);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," depth ",7);
      std::ostream::operator<<((ostream *)&std::cout,(int)local_78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," nodes ",7);
      std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," time ",6);
      utils::getTime();
      std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," pv",3);
      for (_Var6._M_p = this._M_p;
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != paVar4; _Var6._M_p = _Var6._M_p + 8) {
        local_70 = *(Move *)_Var6._M_p;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        board::Move::getString_abi_cxx11_(&local_b8,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
      uVar2 = (ulong)((int)local_78 + 1);
      uVar3 = uVar5;
      _Var6._M_p = this._M_p;
    } while ((int)local_78 < local_90->depth || local_90->depth == -1);
  }
  else {
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    uVar5 = 0;
    this._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)this._M_p != paVar4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bestmove ",9);
    board::Move::getString_abi_cxx11_(&local_b8,(Move *)this._M_p);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)this._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(this._M_p,uVar5 - (long)this._M_p);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_board::Move>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return extraout_RAX;
}

Assistant:

void search::go(board::Board& pos, SearchInfo& info)
{
    int score = NEG_INFINITY;
    PVTable pvtable;
    std::vector<board::Move> pv;
    reset(pos, info);
    for (int depth = 1; info.getDepth() == -1 || depth <= info.getDepth(); depth++) {
        score = negamax(NEG_INFINITY, POS_INFINITY, depth, pos, info, pvtable);
        if (info.getStopped()) {
            break;
        }
        pv = pvtable.getPV(pos);
        std::cout << "info score cp " << score;
        std::cout << " depth " << depth;
        std::cout << " nodes " << info.getNodes();
        std::cout << " time " << (utils::getTime() - info.getStartTime());
        std::cout << " pv";
        for (board::Move move : pv) {
            std::cout << " " << move.getString();
        }
        std::cout << std::endl;
    }
    if (!pv.empty()) {
        std::cout << "bestmove " << pv[0].getString() << std::endl;
    }
}